

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_6,_6> *scalar;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  RhsNested pMVar2;
  undefined8 uVar3;
  Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  MatrixNx3 QiCompact;
  VectorNIP SPK2_5_Block;
  VectorNIP E4_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E5_Block;
  VectorNIP E3_Block;
  VectorNIP E2_Block;
  VectorNIP E6_Block;
  VectorNIP E1_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  Matrix3xN e_bar;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_4550;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_4528;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_4500;
  undefined1 local_44d8 [16];
  scalar_constant_op<double> local_44c8;
  variable_if_dynamic<long,__1> local_44c0;
  scalar_constant_op<double> sStack_44b8;
  scalar_constant_op<double> local_44b0;
  RhsNested local_4498;
  scalar_constant_op<double> local_4490;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_4408;
  undefined1 local_43e0 [64];
  double local_43a0;
  RhsNested local_4398;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_4380;
  undefined1 local_4358 [24];
  RhsNested local_4340;
  scalar_constant_op<double> local_4338;
  RhsNested local_4318;
  scalar_constant_op<double> local_4310;
  undefined1 local_42c0 [32];
  XprTypeNested local_42a0;
  variable_if_dynamic<long,__1> local_4298;
  scalar_constant_op<double> sStack_4290;
  RhsNested local_4288;
  Matrix<double,_64,_1,_0,_64,_1> *local_4280;
  RhsNested local_4270;
  XprTypeNested local_4260;
  variable_if_dynamic<long,__1> local_4258;
  variable_if_dynamic<long,__1> local_4250;
  Index local_4248;
  PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *local_4240;
  Matrix<double,_64,_1,_0,_64,_1> *local_4228;
  XprTypeNested local_4218;
  variable_if_dynamic<long,__1> local_4210;
  scalar_constant_op<double> local_4208;
  RhsNested local_4200;
  Matrix<double,_64,_1,_0,_64,_1> *local_41f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  local_3fa8;
  Matrix<double,_64,_1,_0,_64,_1> local_3f80;
  PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *local_3d80 [64];
  Matrix<double,_64,_1,_0,_64,_1> local_3b80;
  Matrix<double,_64,_1,_0,_64,_1> local_3980;
  PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *local_3780 [64];
  PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *local_3580 [64];
  Matrix<double,__1,__1,_0,__1,__1> *local_3380 [64];
  PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> local_3180 [512];
  Matrix3xN *local_2f80 [64];
  Matrix<double,_64,_1,_0,_64,_1> local_2d80;
  Matrix<double,_64,_1,_0,_64,_1> local_2b80;
  Matrix<double,_64,_1,_0,_64,_1> local_2980;
  undefined1 local_2780 [16];
  variable_if_dynamic<long,__1> local_2770;
  RhsNested local_2760;
  LhsNested local_2758;
  PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *local_2730;
  LhsNested local_2728;
  RhsNested local_2718;
  double *local_2708;
  PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *local_26f8;
  scalar_constant_op<double> local_26f0;
  RhsNested local_26e8;
  undefined8 local_26e0;
  double *local_26d8;
  PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *local_26c8;
  scalar_constant_op<double> local_26c0;
  RhsNested local_26b8;
  undefined8 local_26b0;
  double *local_2698;
  PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *local_2688;
  undefined8 local_2680;
  undefined8 local_2678;
  undefined1 local_2670 [24];
  PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *local_2658;
  undefined8 local_2650;
  undefined8 local_2648;
  undefined8 local_2640;
  double adStack_2580 [64];
  double adStack_2380 [64];
  double adStack_2180 [64];
  double adStack_1f80 [64];
  double adStack_1d80 [64];
  double adStack_1b80 [64];
  double adStack_1980 [64];
  double adStack_1780 [64];
  Matrix3xN local_1580;
  undefined1 local_1280 [1024];
  Matrix<double,_64,_1,_0,_64,_1> local_e80;
  double local_c80 [64];
  double local_a80 [64];
  double local_880 [64];
  double adStack_680 [64];
  double adStack_480 [64];
  double local_280 [74];
  
  local_44d8._8_8_ = local_44d8._0_8_;
  CalcCoordMatrix(this,&local_1580);
  local_42c0._0_8_ = &this->m_SD;
  local_2f80[0] = &local_1580;
  local_2780 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                          local_42c0,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_> *)
                          local_2f80);
  Eigen::PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_0>_>
              *)local_2780);
  local_2758._0_8_ = 0;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 0.0;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 0.0;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2770.m_value = (long)local_1280;
  local_2760.m_expression = (NestedExpressionType)local_1280;
  local_2758.m_rhs = (RhsNested)local_1280;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2708 = local_c80;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_26d8 = local_c80;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2698 = adStack_680;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2670._8_8_ = adStack_680;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_2f80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_2780._0_8_ = &DAT_3ff0000000000000;
  local_42c0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_2f80;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)local_42c0,
             (Scalar *)local_2780);
  local_42c0._0_8_ = 0.5;
  pMVar1 = &this->m_kGQ;
  local_3380[0] = pMVar1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_2780,(double *)local_42c0,(StorageBaseType *)local_3380);
  local_3580[0] = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_2f80;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_3580,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_2780);
  pMVar2 = (RhsNested)(local_1280 + 0x200);
  local_2758._0_8_ = 0x40;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0x40;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 3.16202013338398e-322;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 3.16202013338398e-322;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0x40;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0x40;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2770.m_value = (long)pMVar2;
  local_2760.m_expression = (NestedExpressionType)local_1280;
  local_2758.m_rhs = pMVar2;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2708 = local_a80;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_26d8 = local_a80;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2698 = adStack_480;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2670._8_8_ = adStack_480;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3380,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_2780._0_8_ = &DAT_3ff0000000000000;
  local_42c0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3380;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)local_42c0,
             (Scalar *)local_2780);
  local_42c0._0_8_ = 0.5;
  local_3580[0] = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)pMVar1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_2780,(double *)local_42c0,(StorageBaseType *)local_3580);
  local_3d80[0] = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3380;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_3d80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_2780);
  local_2758._0_8_ = 0x80;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0x80;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 6.32404026676796e-322;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 6.32404026676796e-322;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0x80;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0x80;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2770.m_value = (long)&local_e80;
  local_2760.m_expression = (NestedExpressionType)local_1280;
  local_2758.m_rhs = &local_e80;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2708 = local_880;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_26d8 = local_880;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2698 = local_280;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2670._8_8_ = local_280;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3580,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_2780._0_8_ = &DAT_3ff0000000000000;
  local_42c0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3580;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)local_42c0,
             (Scalar *)local_2780);
  local_42c0._0_8_ = 0.5;
  local_3d80[0] = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)pMVar1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_2780,(double *)local_42c0,(StorageBaseType *)local_3d80);
  local_3780[0] = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3580;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_3780,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_2780);
  local_2758._0_8_ = 0x40;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0x80;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 3.16202013338398e-322;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 6.32404026676796e-322;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0x40;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0x80;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2770.m_value = (long)pMVar2;
  local_2760.m_expression = (NestedExpressionType)local_1280;
  local_2758.m_rhs = &local_e80;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2708 = local_a80;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_26d8 = local_880;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2698 = adStack_480;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  local_2670._8_8_ = local_280;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3d80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_42c0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3d80;
  local_2780._0_8_ = pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_42c0,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_2780);
  local_2770.m_value = (long)local_1280;
  local_2758._0_8_ = 0;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0x80;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 0.0;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 6.32404026676796e-322;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0x80;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2760.m_expression = (NestedExpressionType)local_2770.m_value;
  local_2758.m_rhs = &local_e80;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2708 = local_c80;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_26d8 = local_880;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2698 = adStack_680;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2670._8_8_ = local_280;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3780,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_42c0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)local_3780;
  local_2780._0_8_ = pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_42c0,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_2780);
  local_2770.m_value = (long)local_1280;
  local_2758._0_8_ = 0;
  local_2758.m_lhs._0_8_ = 0;
  local_2758.m_lhs.m_functor.m_other = 9.48606040015193e-322;
  local_2728._0_8_ = 0x40;
  local_2728.m_functor.m_other = 0.0;
  local_2718 = (RhsNested)0xc0;
  local_26f0.m_other = 0.0;
  local_26e8 = (RhsNested)0x1;
  local_26e0 = 0xc0;
  local_26c0.m_other = 3.16202013338398e-322;
  local_26b8 = (RhsNested)0x1;
  local_26b0 = 0xc0;
  local_2680 = 0;
  local_2678 = 2;
  local_2670._0_8_ = 0xc0;
  local_2650 = 0x40;
  local_2648 = 2;
  local_2640 = 0xc0;
  local_2760.m_expression = (NestedExpressionType)local_2770.m_value;
  local_2758.m_rhs = pMVar2;
  local_2730 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2708 = local_c80;
  local_26f8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_26d8 = local_a80;
  local_26c8 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2698 = adStack_680;
  local_2688 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  local_2670._8_8_ = adStack_480;
  local_2658 = (PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_2770.m_value;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const>const>>
            (local_3180,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
              *)local_2780);
  local_2780._0_8_ = pMVar1;
  local_42c0._0_8_ = local_3180;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)local_42c0,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_2780);
  std::__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> *)local_2780
             ,&(this->m_material).
               super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>);
  uVar3 = local_2780._0_8_;
  scalar = (ChMatrixNM<double,_6,_6> *)(local_2780._0_8_ + 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2780 + 8));
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_3f80,(double *)scalar,(StorageBaseType *)local_2f80);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_3b80,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 1,(StorageBaseType *)local_3380);
  local_3980.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[2];
  local_3980.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[3];
  local_3980.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [8] = local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[2];
  local_3980.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [9] = local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[3];
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_44d8,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 2,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_2d80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3980,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_44d8);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_4358,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 3,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_2b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_2d80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_4358);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_43e0,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 4,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_2b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_43e0);
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 5,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4550);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2980,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_3b80,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 6,(StorageBaseType *)local_2f80);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_44d8,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 7,(StorageBaseType *)local_3380);
  local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[2];
  local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
        array[3];
  local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [8] = local_44c8.m_other;
  local_3f80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [9] = (double)local_44c0.m_value;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_4358,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 8,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3980,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3f80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_4358);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_43e0,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 9,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_2d80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3980,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_43e0);
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 10,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_2d80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4550);
  Eigen::operator*(&local_4528,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0xb,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4528);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2b80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_44d8,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0xc,(StorageBaseType *)local_2f80);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_4358,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0xd,(StorageBaseType *)local_3380);
  local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = local_44c8.m_other;
  local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)local_44c0.m_value;
  local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [8] = (double)local_4358._16_8_;
  local_3b80.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [9] = (double)local_4340;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_43e0,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0xe,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3f80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_43e0);
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0xf,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3980,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3f80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4550);
  Eigen::operator*(&local_4528,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x10,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3980,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4528);
  Eigen::operator*(&local_4500,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x11,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4500);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2d80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_4358,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x12,(StorageBaseType *)local_2f80);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_43e0,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x13,(StorageBaseType *)local_3380);
  local_44c0.m_value = local_4358._16_8_;
  sStack_44b8.m_other = (double)local_4340;
  local_4498 = (RhsNested)local_43e0._16_8_;
  local_4490.m_other = (double)local_43e0._24_8_;
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x14,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_44d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4550);
  Eigen::operator*(&local_4528,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x15,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3f80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4528);
  Eigen::operator*(&local_4500,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x16,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3f80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4500);
  Eigen::operator*(&local_4408,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x17,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4408);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3980,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)local_43e0,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x18,(StorageBaseType *)local_2f80);
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x19,(StorageBaseType *)local_3380);
  local_4340 = (RhsNested)local_43e0._16_8_;
  local_4338.m_other = (double)local_43e0._24_8_;
  local_4318 = (RhsNested)local_4550.m_lhs.m_functor.m_other;
  local_4310.m_other = (double)local_4550.m_rhs;
  Eigen::operator*(&local_4528,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1a,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_44d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_4358,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4528);
  Eigen::operator*(&local_4500,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1b,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_44d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4500);
  Eigen::operator*(&local_4408,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1c,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&local_3b80,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4408);
  Eigen::operator*(&local_4380,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1d,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4380);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3f80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  Eigen::operator*(&local_4550,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1e,(StorageBaseType *)local_2f80);
  Eigen::operator*(&local_4528,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x1f,(StorageBaseType *)local_3380);
  local_43e0._24_8_ = local_4550.m_lhs.m_functor.m_other;
  local_43e0._32_8_ = local_4550.m_rhs;
  local_43a0 = local_4528.m_lhs.m_functor.m_other;
  local_4398 = local_4528.m_rhs;
  Eigen::operator*(&local_4500,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x20,(StorageBaseType *)local_3580);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_4358,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_43e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4500);
  Eigen::operator*(&local_4408,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x21,(StorageBaseType *)local_3d80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_44d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_4358,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4408);
  Eigen::operator*(&local_4380,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x22,(StorageBaseType *)local_3780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_44d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_4380);
  Eigen::operator*(&local_3fa8,
                   (((ChMatrixNM<double,_6,_6> *)(uVar3 + 0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array + 0x23,(StorageBaseType *)local_3180);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)local_2780,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)local_42c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_3fa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3b80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)local_2780);
  local_4280 = &local_2980;
  local_4298.m_value = 0;
  sStack_4290.m_other = 0.0;
  local_4288 = (RhsNested)0xc0;
  local_4258.m_value = 0x40;
  local_4250.m_value = 0;
  local_4248 = 0xc0;
  local_44c0.m_value = 0;
  sStack_44b8.m_other = 0.0;
  local_44b0.m_other = 9.48606040015193e-322;
  local_4210.m_value = 0x80;
  local_4208.m_other = 0.0;
  local_41f8 = &local_3f80;
  local_4200 = (RhsNested)0xc0;
  local_44c8.m_other = (double)local_2780;
  local_42c0._16_8_ = (XprTypeNested)local_1280;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = pMVar2;
  local_4260 = (XprTypeNested)local_1280;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3b80;
  local_4228 = &local_e80;
  local_4218 = (XprTypeNested)local_1280;
  local_44d8._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
        *)local_2780;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_2980;
  sStack_4290.m_other = 4.94065645841247e-324;
  local_4288 = (RhsNested)0xc0;
  local_4258.m_value = 0x40;
  local_4250.m_value = 1;
  local_4248 = 0xc0;
  local_4210.m_value = 0x80;
  local_41f8 = &local_3f80;
  local_4208.m_other = 4.94065645841247e-324;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_2180;
  local_44c0.m_value = 0;
  sStack_44b8.m_other = 4.94065645841247e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_44c8.m_other = (double)local_2780;
  local_42c0._16_8_ = local_c80;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)local_a80;
  local_4260 = (XprTypeNested)local_1280;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3b80;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_880;
  local_4218 = (XprTypeNested)local_1280;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_2980;
  sStack_4290.m_other = 9.88131291682493e-324;
  local_4288 = (RhsNested)0xc0;
  local_4258.m_value = 0x40;
  local_4250.m_value = 2;
  local_4248 = 0xc0;
  local_41f8 = &local_3f80;
  local_4210.m_value = 0x80;
  local_4208.m_other = 9.88131291682493e-324;
  local_4200 = (RhsNested)0xc0;
  local_44c8.m_other = (double)local_2780;
  local_44d8._0_8_ = adStack_1b80;
  local_44c0.m_value = 0;
  sStack_44b8.m_other = 9.88131291682493e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = adStack_680;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)adStack_480;
  local_4260 = (XprTypeNested)local_1280;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3b80;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_280;
  local_4218 = (XprTypeNested)local_1280;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  sStack_4290.m_other = 0.0;
  local_4288 = (RhsNested)0xc0;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2b80;
  local_4258.m_value = 0x40;
  local_4250.m_value = 0;
  local_4248 = 0xc0;
  local_44c8.m_other = (double)local_2780;
  local_4210.m_value = 0x80;
  local_4208.m_other = 0.0;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_2580;
  local_44c0.m_value = 0x40;
  sStack_44b8.m_other = 0.0;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = (XprTypeNested)local_1280;
  local_42a0 = (XprTypeNested)local_1280;
  local_4280 = &local_3b80;
  local_4270 = pMVar2;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = &local_e80;
  local_4218 = (XprTypeNested)local_1280;
  local_41f8 = &local_3980;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_3b80;
  sStack_4290.m_other = 4.94065645841247e-324;
  local_4288 = (RhsNested)0xc0;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2b80;
  local_4258.m_value = 0x40;
  local_4250.m_value = 1;
  local_4248 = 0xc0;
  local_4210.m_value = 0x80;
  local_44c8.m_other = (double)local_2780;
  local_4208.m_other = 4.94065645841247e-324;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_1f80;
  local_44c0.m_value = 0x40;
  sStack_44b8.m_other = 4.94065645841247e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = local_c80;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)local_a80;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_880;
  local_4218 = (XprTypeNested)local_1280;
  local_41f8 = &local_3980;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_3b80;
  sStack_4290.m_other = 9.88131291682493e-324;
  local_4288 = (RhsNested)0xc0;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_2b80;
  local_4258.m_value = 0x40;
  local_4250.m_value = 2;
  local_4248 = 0xc0;
  local_4210.m_value = 0x80;
  local_44c8.m_other = (double)local_2780;
  local_4208.m_other = 9.88131291682493e-324;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_1980;
  local_44c0.m_value = 0x40;
  sStack_44b8.m_other = 9.88131291682493e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = adStack_680;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)adStack_480;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_280;
  local_4218 = (XprTypeNested)local_1280;
  local_41f8 = &local_3980;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4280 = &local_3f80;
  local_4298.m_value = 0;
  sStack_4290.m_other = 0.0;
  local_4288 = (RhsNested)0xc0;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3980;
  local_4258.m_value = 0x40;
  local_4250.m_value = 0;
  local_4248 = 0xc0;
  local_44c8.m_other = (double)local_2780;
  local_44d8._0_8_ = adStack_2380;
  local_4210.m_value = 0x80;
  local_4208.m_other = 0.0;
  local_44c0.m_value = 0x80;
  sStack_44b8.m_other = 0.0;
  local_4200 = (RhsNested)0xc0;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = (XprTypeNested)local_1280;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = pMVar2;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = &local_e80;
  local_4218 = (XprTypeNested)local_1280;
  local_41f8 = &local_2d80;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_3f80;
  sStack_4290.m_other = 4.94065645841247e-324;
  local_4288 = (RhsNested)0xc0;
  local_4258.m_value = 0x40;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3980;
  local_4250.m_value = 1;
  local_4248 = 0xc0;
  local_4210.m_value = 0x80;
  local_4208.m_other = 4.94065645841247e-324;
  local_44c8.m_other = (double)local_2780;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_1d80;
  local_44c0.m_value = 0x80;
  sStack_44b8.m_other = 4.94065645841247e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_42c0._16_8_ = local_c80;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)local_a80;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_880;
  local_4218 = (XprTypeNested)local_1280;
  local_41f8 = &local_2d80;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_4298.m_value = 0;
  local_4280 = &local_3f80;
  sStack_4290.m_other = 9.88131291682493e-324;
  local_4288 = (RhsNested)0xc0;
  local_4240 = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_3980;
  local_4258.m_value = 0x40;
  local_4250.m_value = 2;
  local_4248 = 0xc0;
  local_41f8 = &local_2d80;
  local_4210.m_value = 0x80;
  local_4208.m_other = 9.88131291682493e-324;
  local_4200 = (RhsNested)0xc0;
  local_44d8._0_8_ = adStack_1780;
  local_44c0.m_value = 0x80;
  sStack_44b8.m_other = 9.88131291682493e-324;
  local_44b0.m_other = 9.48606040015193e-322;
  local_44c8.m_other = (double)local_2780;
  local_42c0._16_8_ = adStack_680;
  local_42a0 = (XprTypeNested)local_1280;
  local_4270 = (RhsNested)adStack_480;
  local_4260 = (XprTypeNested)local_1280;
  local_4228 = (Matrix<double,_64,_1,_0,_64,_1> *)local_280;
  local_4218 = (XprTypeNested)local_1280;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)local_44d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)local_42c0);
  local_44d8 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->m_SD,
                          (MatrixBase<Eigen::Matrix<double,_192,_3,_0,_192,_3>_> *)local_2780);
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,3,1,32,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,192,3,0,192,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,32,3,1,32,3>> *)local_42c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_192,_3,_0,_192,_3>,_0>_>
              *)local_44d8);
  local_44d8._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
        *)local_42c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,96,1,0,96,1>,0,Eigen::Stride<0,0>>>
            (Fi,(Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> *)local_44d8);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed.  For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 12 in xi, 12 in eta, and 12
    // in zeta. This requires GQ 7 points along the xi, eta, and zeta directions for "Full Integration". However, very
    // similar results can be obtained with fewer GQ point in each direction, resulting in significantly fewer
    // calculations.  Based on testing, this could be as low as 4x4x4

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ]
    // FC = [F12  F22  F32 ]
    //      [F13  F23  F33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point to make the calculation of the 2nd
    // Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
    //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

    P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

    P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}